

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

int deflate_block(BGZF *fp,int block_length)

{
  Bytef *_dst;
  z_stream *pzVar1;
  int iVar2;
  int local_14;
  
  local_14 = 0x10000;
  _dst = (Bytef *)fp->compressed_block;
  if (*(int *)fp < 0) {
    pzVar1 = fp->gz_stream;
    pzVar1->next_in = (Bytef *)fp->uncompressed_block;
    pzVar1->avail_in = block_length;
    pzVar1->next_out = _dst;
    pzVar1->avail_out = 0x10000;
    iVar2 = deflate(pzVar1,(ulong)(block_length == 0) << 2);
    if (iVar2 == -2) goto LAB_0013cf16;
    local_14 = 0x10000 - pzVar1->avail_out;
  }
  else {
    iVar2 = bgzf_compress(_dst,&local_14,fp->uncompressed_block,block_length,
                          (*(int *)fp << 3) >> 0x17);
    if (iVar2 != 0) {
LAB_0013cf16:
      *(byte *)fp = *(byte *)fp | 1;
      return -1;
    }
  }
  fp->block_offset = 0;
  return local_14;
}

Assistant:

static int deflate_block(BGZF *fp, int block_length)
{
    int comp_size = BGZF_MAX_BLOCK_SIZE;
    int ret;
    if ( !fp->is_gzip )
        ret = bgzf_compress(fp->compressed_block, &comp_size, fp->uncompressed_block, block_length, fp->compress_level);
    else
        ret = bgzf_gzip_compress(fp, fp->compressed_block, &comp_size, fp->uncompressed_block, block_length, fp->compress_level);

    if ( ret != 0 )
    {
        fp->errcode |= BGZF_ERR_ZLIB;
        return -1;
    }
    fp->block_offset = 0;
    return comp_size;
}